

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

Entry * __thiscall
Ptex::v2_2::PtexReader::MetaData::newEntry
          (MetaData *this,uint8_t keysize,char *key,uint8_t datatype,uint32_t datasize,
          size_t *metaDataMemUsed)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>
  _Var1;
  undefined7 in_register_00000031;
  uint32_t uVar2;
  ulong uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>,_bool>
  pVar4;
  Entry *e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  size_t *local_d0;
  Entry local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>
  local_88;
  
  uVar3 = CONCAT71(in_register_00000031,keysize) & 0xffffffff;
  local_f0 = &local_e0;
  local_d0 = metaDataMemUsed;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,key,key + uVar3);
  local_c8.data._0_1_ = 0;
  local_c8.data._1_7_ = 0;
  local_c8.isLmd = false;
  local_c8.key = (char *)0x0;
  local_c8.type._0_1_ = mdt_string;
  local_c8._9_7_ = 0;
  local_c8.lmdData = (LargeMetaData *)0x0;
  local_c8.lmdPos = 0;
  local_c8.lmdZipSize = 0;
  local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
  if (local_f0 == &local_e0) {
    local_88.first.field_2._8_8_ = local_e0._8_8_;
  }
  else {
    local_88.first._M_dataplus._M_p = (pointer)local_f0;
  }
  local_88.first._M_string_length = local_e8;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_88.second.type = mdt_string;
  local_88.second.datasize = 0;
  local_88.second.data = (char *)0x0;
  local_88.second._24_8_ = (ulong)(uint7)local_c8._25_7_ << 8;
  local_88.second.key = (char *)0x0;
  local_88.second.lmdData = (LargeMetaData *)0x0;
  local_88.second.lmdPos = 0;
  local_88.second._48_8_ = (ulong)local_c8.index << 0x20;
  local_f0 = &local_e0;
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Ptex::v2_2::PtexReader::MetaData::Entry>,std::_Select1st<std::pair<std::__cxx11::string_const,Ptex::v2_2::PtexReader::MetaData::Entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Ptex::v2_2::PtexReader::MetaData::Entry>>>
          ::
          _M_emplace_unique<std::pair<std::__cxx11::string,Ptex::v2_2::PtexReader::MetaData::Entry>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Ptex::v2_2::PtexReader::MetaData::Entry>,std::_Select1st<std::pair<std::__cxx11::string_const,Ptex::v2_2::PtexReader::MetaData::Entry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Ptex::v2_2::PtexReader::MetaData::Entry>>>
                      *)&this->_map,&local_88);
  _Var1 = pVar4.first._M_node;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>
  ::~pair(&local_88);
  Entry::clear(&local_c8);
  std::__cxx11::string::~string((string *)&local_f0);
  local_88.first._M_dataplus._M_p = (pointer)(_Var1._M_node + 2);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uVar2 = *(uint32_t *)((long)&_Var1._M_node[3]._M_left + 4);
    Entry::clear((Entry *)local_88.first._M_dataplus._M_p);
  }
  else {
    uVar2 = (uint32_t)
            ((ulong)((long)(this->_entries).
                           super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_entries).
                          super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
    ::push_back(&this->_entries,(value_type *)&local_88);
  }
  *(undefined8 *)local_88.first._M_dataplus._M_p = *(undefined8 *)(_Var1._M_node + 1);
  *(uint *)(local_88.first._M_dataplus._M_p + 8) = (uint)datatype;
  *(uint32_t *)(local_88.first._M_dataplus._M_p + 0xc) = datasize;
  *(uint32_t *)(local_88.first._M_dataplus._M_p + 0x34) = uVar2;
  *local_d0 = *local_d0 + uVar3 + 0x59;
  return (Entry *)local_88.first._M_dataplus._M_p;
}

Assistant:

Entry* newEntry(uint8_t keysize, const char* key, uint8_t datatype, uint32_t datasize, size_t& metaDataMemUsed)
	{
	    std::pair<MetaMap::iterator,bool> result =
		_map.insert(std::make_pair(std::string(key, keysize), Entry()));
	    Entry* e = &result.first->second;
	    bool newentry = result.second;
	    uint32_t index = 0;
	    if (newentry) {
		index = uint32_t(_entries.size());
		_entries.push_back(e);
	    }
	    else {
		index = e->index;
		e->clear();
	    }
	    e->key = result.first->first.c_str();
	    e->type = MetaDataType(datatype);
	    e->datasize = datasize;
	    e->index = index;
            metaDataMemUsed += sizeof(std::string) + keysize + 1 + sizeof(Entry);
            return e;
        }